

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O1

int ll_insert_tail(ll_head *q_head,ll_elem *n,int wait)

{
  atomic_size_t *paVar1;
  atomic_size_t aVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ll_elem *plVar6;
  ll_elem *plVar7;
  bool bVar8;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x487,
                  "int ll_insert_tail(struct ll_head *, struct ll_elem *, int)");
  }
  plVar7 = (ll_elem *)((ulong)n & 0xfffffffffffffffc);
  if (plVar7 != n) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x488,
                  "int ll_insert_tail(struct ll_head *, struct ll_elem *, int)");
  }
  if (wait == 0) {
    uVar4 = 0;
LAB_00102d9f:
    LOCK();
    uVar5 = n->succ;
    bVar8 = uVar4 == uVar5;
    if (bVar8) {
      n->succ = uVar4 | 2;
      uVar5 = uVar4;
    }
    UNLOCK();
    if (!bVar8) goto code_r0x00102db0;
    uVar4 = n->pred;
    while (1 < uVar4) {
      uVar4 = n->pred;
    }
LAB_00102dce:
    if (!bVar8) {
      return 0;
    }
    goto LAB_00102dd8;
  }
  unlink_release((ll_head *)n,(ll_elem *)0x1,wait);
LAB_00102dd8:
  LOCK();
  plVar7->refcnt = plVar7->refcnt + 1;
  UNLOCK();
  do {
    plVar6 = pred(q_head,&q_head->q);
    plVar6 = (ll_elem *)((ulong)plVar6 & 0xfffffffffffffffc);
    iVar3 = insert_between(q_head,n,plVar6,&q_head->q);
    if (iVar3 != 0) {
      LOCK();
      paVar1 = &plVar6->refcnt;
      aVar2 = *paVar1;
      *paVar1 = *paVar1 - 1;
      UNLOCK();
      if (aVar2 != 0) {
        LOCK();
        paVar1 = &plVar7->refcnt;
        aVar2 = *paVar1;
        *paVar1 = *paVar1 - 1;
        UNLOCK();
        if (aVar2 != 0) {
          return 1;
        }
      }
      break;
    }
    LOCK();
    paVar1 = &plVar6->refcnt;
    aVar2 = *paVar1;
    *paVar1 = *paVar1 - 1;
    UNLOCK();
  } while (aVar2 != 0);
  __assert_fail("old >= count",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x9a,
                "void deref_release(struct ll_head *, struct ll_elem *, size_t)");
code_r0x00102db0:
  uVar4 = uVar5;
  if (1 < uVar5) goto LAB_00102dce;
  goto LAB_00102d9f;
}

Assistant:

int
ll_insert_tail(struct ll_head *q_head, struct ll_elem *n, int wait)
{
	struct ll_elem	*q, *p;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));

	/*
	 * Mark n for insert.  If this fails, n is either on a queue or
	 * being inserted/deleted.
	 *
	 * Required that n is properly initialized.
	 */
	if (wait)
		unlink_release(q_head, n, 1);
	else if (!insert_lock(n))
		return 0;
	deref_acquire(n, 1);

	p = ptr_clear(pred(q_head, q));

	/*
	 * We now have:
	 * - p -- the predecessor of the insert position
	 * - q -- the successor of the insert position
	 * - n -- the node we need to insert between p and q
	 *
	 * Note that p may be deleted by the time we read this
	 * comment.
	 */
	while (!insert_between(q_head, n, p, q)) {
		/*
		 * Insert failed.
		 * This means p is no longer suitable.
		 */

		/* Re-resolve s. */
		deref_release(q_head, p, 1);
		p = ptr_clear(pred(q_head, q));
	}

	/*
	 * We have succesfully inserted n.  Release our reference on n and p.
	 */
	deref_release(q_head, p, 1);
	deref_release(q_head, n, 1);
	return 1;
}